

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall icu_63::DecimalFormat::DecimalFormat(DecimalFormat *this,DecimalFormat *source)

{
  DecimalFormatSymbols *pDVar1;
  uint in_EAX;
  DecimalFormatFields *pDVar2;
  DecimalFormatSymbols *source_00;
  DecimalFormatSymbols *this_00;
  DecimalFormatProperties *this_01;
  DecimalFormat *size;
  UErrorCode localStatus;
  undefined8 uStack_28;
  
  size = source;
  uStack_28._0_4_ = in_EAX;
  NumberFormat::NumberFormat(&this->super_NumberFormat,&source->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__DecimalFormat_003b3e48;
  pDVar2 = (DecimalFormatFields *)UMemory::operator_new((UMemory *)0x8a8,(size_t)size);
  if (pDVar2 == (DecimalFormatFields *)0x0) {
    pDVar2 = (DecimalFormatFields *)0x0;
  }
  else {
    size = (DecimalFormat *)0x0;
    memset(pDVar2,0,0x8a8);
    icu_63::number::impl::DecimalFormatFields::DecimalFormatFields(pDVar2);
  }
  this->fields = pDVar2;
  if (pDVar2 != (DecimalFormatFields *)0x0) {
    source_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0x2f8,(size_t)size);
    if (source_00 == (DecimalFormatSymbols *)0x0) {
      source_00 = (DecimalFormatSymbols *)0x0;
    }
    else {
      icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties
                ((DecimalFormatProperties *)source_00,
                 (source->fields->properties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr);
    }
    LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInstead
              (&pDVar2->properties,(DecimalFormatProperties *)source_00);
    pDVar2 = this->fields;
    this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)source_00);
    if (this_00 == (DecimalFormatSymbols *)0x0) {
      this_00 = (DecimalFormatSymbols *)0x0;
    }
    else {
      source_00 = (source->fields->symbols).
                  super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
      DecimalFormatSymbols::DecimalFormatSymbols(this_00,source_00);
    }
    pDVar1 = (pDVar2->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
    if (pDVar1 != (DecimalFormatSymbols *)0x0) {
      (*(pDVar1->super_UObject)._vptr_UObject[1])();
    }
    (pDVar2->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr = this_00;
    pDVar2 = this->fields;
    this_01 = (DecimalFormatProperties *)UMemory::operator_new((UMemory *)0x2f8,(size_t)source_00);
    if (this_01 == (DecimalFormatProperties *)0x0) {
      this_01 = (DecimalFormatProperties *)0x0;
    }
    else {
      icu_63::number::impl::DecimalFormatProperties::DecimalFormatProperties(this_01);
    }
    LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInstead
              (&pDVar2->exportedProperties,this_01);
    pDVar2 = this->fields;
    if ((((pDVar2->properties).super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>
          .ptr != (DecimalFormatProperties *)0x0) &&
        ((pDVar2->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr !=
         (DecimalFormatSymbols *)0x0)) &&
       ((pDVar2->exportedProperties).
        super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr !=
        (DecimalFormatProperties *)0x0)) {
      uStack_28 = (ulong)(uint)uStack_28;
      touch(this,(UErrorCode *)((long)&uStack_28 + 4));
    }
  }
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const DecimalFormat& source) : NumberFormat(source) {
    // Note: it is not safe to copy fields->formatter or fWarehouse directly because fields->formatter might have
    // dangling pointers to fields inside fWarehouse. The safe thing is to re-construct fields->formatter from
    // the property bag, despite being somewhat slower.
    fields = new DecimalFormatFields();
    if (fields == nullptr) {
        return;
    }
    fields->properties.adoptInstead(new DecimalFormatProperties(*source.fields->properties));
    fields->symbols.adoptInstead(new DecimalFormatSymbols(*source.fields->symbols));
    fields->exportedProperties.adoptInstead(new DecimalFormatProperties());
    if (fields->properties == nullptr || fields->symbols == nullptr || fields->exportedProperties == nullptr) {
        return;
    }
    touchNoError();
}